

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# markdownhighlighter.cpp
# Opt level: O0

void __thiscall MarkdownHighlighter::cssHighlighter(MarkdownHighlighter *this,QString *text)

{
  QString *aname;
  CaseSensitivity CVar1;
  qsizetype qVar2;
  bool bVar3;
  byte bVar4;
  int iVar5;
  int iVar6;
  int iVar7;
  uint uVar8;
  QColor *pQVar9;
  QTextCharFormat *pQVar10;
  int iVar11;
  undefined1 auVar12 [16];
  bool local_211;
  QTextCharFormat local_208;
  QBrush local_1f8 [8];
  QBrush local_1f0 [12];
  HighlighterState local_1e4;
  undefined1 local_1e0 [8];
  QTextCharFormat f;
  Spec local_1c8;
  ushort uStack_1c4;
  Spec local_1a8;
  ushort uStack_1a4;
  QColor local_18c;
  QColor local_17c;
  undefined1 local_16c [8];
  QColor foreground;
  int lightness;
  QTextFormat local_150 [8];
  undefined1 local_148 [8];
  QString b;
  QString g;
  QString r;
  QLatin1Char local_f7;
  QChar local_f6;
  int bPos;
  QLatin1Char local_ef;
  QChar local_ee;
  int gPos;
  QLatin1Char local_e7;
  QChar local_e6;
  int rPos;
  undefined1 auStack_e0 [4];
  int t;
  undefined1 local_c0 [8];
  QColor c;
  QString color;
  CaseSensitivity local_90;
  QChar local_8a;
  int semicolon;
  CaseSensitivity local_84;
  undefined1 auStack_80 [4];
  int colon;
  QStringView local_70;
  QStringView local_60;
  QLatin1Char local_49;
  QChar local_48;
  QChar local_46;
  HighlighterState local_44;
  QLatin1Char local_3f;
  QChar local_3e;
  QLatin1Char local_3b;
  QChar local_3a;
  CaseSensitivity local_38;
  QChar local_34;
  QChar local_32;
  int space;
  QChar local_2c;
  QLatin1Char local_29;
  QChar local_28;
  QChar local_26;
  CaseSensitivity local_24;
  qsizetype qStack_20;
  int i;
  qsizetype textLen;
  QString *text_local;
  MarkdownHighlighter *this_local;
  
  textLen = (qsizetype)text;
  text_local = (QString *)this;
  bVar3 = QString::isEmpty(text);
  if (!bVar3) {
    qStack_20 = QString::length((QString *)textLen);
    for (local_24 = CaseInsensitive; (int)local_24 < qStack_20; local_24 = local_24 + CaseSensitive)
    {
      local_26 = QString::operator[]((QString *)textLen,(long)(int)local_24);
      QLatin1Char::QLatin1Char(&local_29,'.');
      QChar::QChar(&local_28,local_29);
      bVar3 = ::operator==(local_26,local_28);
      iVar11 = (int)this;
      if (bVar3) {
LAB_0013a199:
        if (qStack_20 <= (int)(local_24 + CaseSensitive)) {
          return;
        }
        local_32 = QString::operator[]((QString *)textLen,(long)(int)(local_24 + CaseSensitive));
        bVar3 = QChar::isSpace(&local_32);
        local_211 = true;
        if (!bVar3) {
          local_34 = QString::operator[]((QString *)textLen,(long)(int)(local_24 + CaseSensitive));
          local_211 = QChar::isNumber(&local_34);
        }
        qVar2 = textLen;
        if (local_211 == false) {
          QLatin1Char::QLatin1Char(&local_3b,' ');
          QChar::QChar(&local_3a,local_3b);
          local_38 = QString::indexOf((QChar *)qVar2,(ulong)(ushort)local_3a.ucs,local_24);
          qVar2 = textLen;
          if ((int)local_38 < 0) {
            QLatin1Char::QLatin1Char(&local_3f,'{');
            QChar::QChar(&local_3e,local_3f);
            local_38 = QString::indexOf((QChar *)qVar2,(ulong)(ushort)local_3e.ucs,local_24);
            if ((int)local_38 < 0) {
              local_38 = (CaseSensitivity)qStack_20;
            }
          }
          CVar1 = local_24;
          uVar8 = local_38 - local_24;
          local_44 = CodeKeyWord;
          QHash<MarkdownHighlighter::HighlighterState,_QTextCharFormat>::operator[]
                    (&_formats,&local_44);
          QSyntaxHighlighter::setFormat(iVar11,CVar1,(QTextCharFormat *)(ulong)uVar8);
          local_24 = local_38;
        }
      }
      else {
        local_2c = QString::operator[]((QString *)textLen,(long)(int)local_24);
        QLatin1Char::QLatin1Char((QLatin1Char *)((long)&space + 1),'#');
        QChar::QChar((QChar *)((long)&space + 2),space._1_1_);
        bVar3 = ::operator==(local_2c,space._2_2_);
        if (bVar3) goto LAB_0013a199;
        local_46 = QString::operator[]((QString *)textLen,(long)(int)local_24);
        QLatin1Char::QLatin1Char(&local_49,'c');
        QChar::QChar(&local_48,local_49);
        bVar3 = ::operator==(local_46,local_48);
        if (bVar3) {
          QStringView::QStringView<QString,_true>(&local_70,(QString *)textLen);
          local_60 = QStringView::mid(&local_70,(long)(int)local_24,5);
          QLatin1String::QLatin1String((QLatin1String *)auStack_80,"color");
          bVar3 = ::operator==(local_60,_auStack_80);
          qVar2 = textLen;
          if (bVar3) {
            local_24 = local_24 + 5;
            QLatin1Char::QLatin1Char((QLatin1Char *)((long)&semicolon + 1),':');
            QChar::QChar((QChar *)((long)&semicolon + 2),semicolon._1_1_);
            local_84 = QString::indexOf((QChar *)qVar2,(ulong)semicolon._2_2_,local_24);
            CVar1 = local_84;
            if (-1 < (int)local_84) {
              do {
                local_24 = CVar1 + CaseSensitive;
                if (qStack_20 <= (int)local_24) break;
                local_8a = QString::operator[]((QString *)textLen,(long)(int)local_24);
                bVar3 = QChar::isSpace(&local_8a);
                CVar1 = local_24;
              } while (((bVar3 ^ 0xffU) & 1) == 0);
              qVar2 = textLen;
              QLatin1Char::QLatin1Char((QLatin1Char *)((long)&color.d.size + 5),';');
              QChar::QChar((QChar *)((long)&color.d.size + 6),color.d.size._5_1_);
              local_90 = QString::indexOf((QChar *)qVar2,(ulong)color.d.size._6_2_,local_24);
              if ((int)local_90 < 0) {
                local_90 = (CaseSensitivity)qStack_20;
              }
              aname = (QString *)((long)&c.ct + 4);
              QString::mid((longlong)aname,textLen);
              QColor::QColor((QColor *)local_c0,aname);
              QLatin1String::QLatin1String((QLatin1String *)auStack_e0,"rgb");
              bVar4 = QString::startsWith((QLatin1String *)((long)&c.ct + 4),
                                          (CaseSensitivity)_auStack_e0);
              qVar2 = textLen;
              if ((bVar4 & 1) != 0) {
                QLatin1Char::QLatin1Char(&local_e7,'(');
                QChar::QChar(&local_e6,local_e7);
                rPos = QString::indexOf((QChar *)qVar2,(ulong)(ushort)local_e6.ucs,local_24);
                qVar2 = textLen;
                QLatin1Char::QLatin1Char(&local_ef,',');
                QChar::QChar(&local_ee,local_ef);
                gPos = QString::indexOf((QChar *)qVar2,(ulong)(ushort)local_ee.ucs,rPos);
                qVar2 = textLen;
                QLatin1Char::QLatin1Char(&local_f7,',');
                QChar::QChar(&local_f6,local_f7);
                bPos = QString::indexOf((QChar *)qVar2,(ulong)(ushort)local_f6.ucs,
                                        gPos + CaseSensitive);
                qVar2 = textLen;
                QLatin1Char::QLatin1Char((QLatin1Char *)((long)&r.d.size + 1),')');
                QChar::QChar((QChar *)((long)&r.d.size + 2),r.d.size._1_1_);
                r.d.size._4_4_ = QString::indexOf((QChar *)qVar2,(ulong)r.d.size._2_2_,bPos);
                if (((gPos < 0) || (bPos < 0)) || (r.d.size._4_4_ < 0)) {
                  lightness = -1;
                  QHash<MarkdownHighlighter::HighlighterState,_QTextCharFormat>::operator[]
                            (&_formats,&lightness);
                  QTextFormat::background(local_150);
                  pQVar9 = QBrush::color((QBrush *)local_150);
                  local_c0 = *(undefined1 (*) [8])pQVar9;
                  c.cspec = *(Spec *)((long)&pQVar9->ct + 4);
                  c.ct.argb.alpha = (pQVar9->ct).argb.pad;
                  QBrush::~QBrush((QBrush *)local_150);
                }
                else {
                  QString::mid((longlong)&g.d.size,textLen);
                  QString::mid((longlong)&b.d.size,textLen);
                  QString::mid((longlong)local_148,textLen);
                  iVar7 = QString::toInt((QString *)&g.d.size,(bool *)0x0,10);
                  iVar5 = QString::toInt((QString *)&b.d.size,(bool *)0x0,10);
                  iVar6 = QString::toInt((QString *)local_148,(bool *)0x0,10);
                  QColor::setRgb((int)local_c0,iVar7,iVar5,iVar6);
                  QString::~QString((QString *)local_148);
                  QString::~QString((QString *)&b.d.size);
                  QString::~QString((QString *)&g.d.size);
                }
              }
              bVar3 = QColor::isValid((QColor *)local_c0);
              if (bVar3) {
                foreground.ct._4_4_ = 0;
                QColor::QColor((QColor *)local_16c);
                iVar7 = QColor::lightness();
                if (iVar7 < 0x15) {
                  QColor::operator=((QColor *)local_16c,white);
                }
                else {
                  iVar7 = QColor::lightness();
                  if ((iVar7 < 0x15) || (iVar7 = QColor::lightness(), 0x33 < iVar7)) {
                    iVar7 = QColor::lightness();
                    if ((iVar7 < 0x34) || (iVar7 = QColor::lightness(), 0x6e < iVar7)) {
                      iVar7 = QColor::lightness();
                      if (iVar7 < 0x80) {
                        iVar7 = QColor::lightness();
                        foreground.ct._4_4_ = iVar7 + 100;
                        auVar12 = QColor::lighter((int)local_c0);
                        f._8_8_ = auVar12._0_8_;
                        local_1c8 = auVar12._8_4_;
                        uStack_1c4 = auVar12._12_2_;
                        foreground.cspec = local_1c8;
                        foreground.ct.argb.alpha = uStack_1c4;
                        local_16c = (undefined1  [8])f._8_8_;
                      }
                      else {
                        iVar7 = QColor::lightness();
                        foreground.ct._4_4_ = iVar7 + 100;
                        auVar12 = QColor::darker((int)local_c0);
                        local_16c = auVar12._0_8_;
                        local_1a8 = auVar12._8_4_;
                        uStack_1a4 = auVar12._12_2_;
                        foreground.cspec = local_1a8;
                        foreground.ct.argb.alpha = uStack_1a4;
                      }
                    }
                    else {
                      QColor::QColor(&local_18c,0xbb,0xbb,0xbb,0xff);
                      local_16c = (undefined1  [8])local_18c._0_8_;
                      foreground.cspec = local_18c.ct._4_4_;
                      foreground.ct.argb.alpha = local_18c.ct.argb.pad;
                    }
                  }
                  else {
                    QColor::QColor(&local_17c,0xcc,0xcc,0xcc,0xff);
                    local_16c = (undefined1  [8])local_17c._0_8_;
                    foreground.cspec = local_17c.ct._4_4_;
                    foreground.ct.argb.alpha = local_17c.ct.argb.pad;
                  }
                }
                local_1e4 = CodeBlock;
                pQVar10 = QHash<MarkdownHighlighter::HighlighterState,_QTextCharFormat>::operator[]
                                    (&_formats,&local_1e4);
                QTextCharFormat::QTextCharFormat((QTextCharFormat *)local_1e0,pQVar10);
                QBrush::QBrush(local_1f0,(QColor *)local_c0,SolidPattern);
                QTextFormat::setBackground((QTextFormat *)local_1e0,local_1f0);
                QBrush::~QBrush(local_1f0);
                QBrush::QBrush(local_1f8,(QColor *)local_16c,SolidPattern);
                QTextFormat::setForeground((QTextFormat *)local_1e0,local_1f8);
                QBrush::~QBrush(local_1f8);
                CVar1 = local_24;
                uVar8 = local_90 - local_24;
                QTextCharFormat::QTextCharFormat(&local_208);
                QSyntaxHighlighter::setFormat(iVar11,CVar1,(QTextCharFormat *)(ulong)uVar8);
                QTextCharFormat::~QTextCharFormat(&local_208);
                QSyntaxHighlighter::setFormat
                          (iVar11,local_24,(QTextCharFormat *)(ulong)(local_90 - local_24));
                local_24 = local_90;
                QTextCharFormat::~QTextCharFormat((QTextCharFormat *)local_1e0);
                foreground._12_4_ = 0;
              }
              else {
                foreground._12_4_ = 4;
              }
              QString::~QString((QString *)((long)&c.ct + 4));
            }
          }
        }
      }
    }
  }
  return;
}

Assistant:

void MarkdownHighlighter::cssHighlighter(const QString &text) {
    if (text.isEmpty()) return;
    const auto textLen = text.length();
    for (int i = 0; i < textLen; ++i) {
        if (text[i] == QLatin1Char('.') || text[i] == QLatin1Char('#')) {
            if (i + 1 >= textLen) return;
            if (text[i + 1].isSpace() || text[i + 1].isNumber()) continue;
            int space = text.indexOf(QLatin1Char(' '), i);
            if (space < 0) {
                space = text.indexOf(QLatin1Char('{'), i);
                if (space < 0) {
                    space = textLen;
                }
            }
            setFormat(i, space - i, _formats[CodeKeyWord]);
            i = space;
        } else if (text[i] == QLatin1Char('c')) {
            if (MH_SUBSTR(i, 5) == QLatin1String("color")) {
                i += 5;
                const int colon = text.indexOf(QLatin1Char(':'), i);
                if (colon < 0) continue;
                i = colon;
                ++i;
                while (i < textLen) {
                    if (!text[i].isSpace()) break;
                    ++i;
                }
                int semicolon = text.indexOf(QLatin1Char(';'), i);
                if (semicolon < 0) semicolon = textLen;
                const QString color = text.mid(i, semicolon - i);
                QColor c(color);
                if (color.startsWith(QLatin1String("rgb"))) {
                    const int t = text.indexOf(QLatin1Char('('), i);
                    const int rPos = text.indexOf(QLatin1Char(','), t);
                    const int gPos = text.indexOf(QLatin1Char(','), rPos + 1);
                    const int bPos = text.indexOf(QLatin1Char(')'), gPos);
                    if (rPos > -1 && gPos > -1 && bPos > -1) {
                        const QString r = text.mid(t + 1, rPos - (t + 1));
                        const QString g = text.mid(rPos + 1, gPos - (rPos + 1));
                        const QString b = text.mid(gPos + 1, bPos - (gPos + 1));
                        c.setRgb(r.toInt(), g.toInt(), b.toInt());
                    } else {
                        c = _formats[HighlighterState::NoState]
                                .background()
                                .color();
                    }
                }

                if (!c.isValid()) {
                    continue;
                }

                int lightness{};
                QColor foreground;
                // really dark
                if (c.lightness() <= 20) {
                    foreground = Qt::white;
                } else if (c.lightness() > 20 && c.lightness() <= 51) {
                    foreground = QColor(204, 204, 204);
                } else if (c.lightness() > 51 && c.lightness() <= 110) {
                    foreground = QColor(187, 187, 187);
                } else if (c.lightness() > 127) {
                    lightness = c.lightness() + 100;
                    foreground = c.darker(lightness);
                } else {
                    lightness = c.lightness() + 100;
                    foreground = c.lighter(lightness);
                }

                QTextCharFormat f = _formats[CodeBlock];
                f.setBackground(c);
                f.setForeground(foreground);
                // clear prev format
                setFormat(i, semicolon - i, QTextCharFormat());
                setFormat(i, semicolon - i, f);
                i = semicolon;
            }
        }
    }
}